

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locbased.cpp
# Opt level: O1

void __thiscall
icu_63::LocaleBased::setLocaleIDs(LocaleBased *this,Locale *validID,Locale *actualID)

{
  strcpy(this->valid,validID->fullName);
  strcpy(this->actual,actualID->fullName);
  return;
}

Assistant:

void LocaleBased::setLocaleIDs(const Locale& validID, const Locale& actualID) {
  uprv_strcpy(valid, validID.getName());
  uprv_strcpy(actual, actualID.getName());
}